

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFMatrix.cpp
# Opt level: O2

void __thiscall PDFMatrix::PDFMatrix(PDFMatrix *this,PDFMatrix *inOther)

{
  double dVar1;
  
  dVar1 = inOther->b;
  this->a = inOther->a;
  this->b = dVar1;
  dVar1 = inOther->d;
  this->c = inOther->c;
  this->d = dVar1;
  dVar1 = inOther->f;
  this->e = inOther->e;
  this->f = dVar1;
  return;
}

Assistant:

PDFMatrix::PDFMatrix(const PDFMatrix& inOther) {
    a = inOther.a;
    b = inOther.b;
    c = inOther.c;
    d = inOther.d;
    e = inOther.e;
    f = inOther.f;
}